

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPM2B_SENSITIVE_Unmarshal(TPM2B_SENSITIVE *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  INT32 startSize;
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPM2B_SENSITIVE *target_local;
  
  target_local._4_4_ = UINT16_Unmarshal(&target->size,buffer,size);
  if (target_local._4_4_ == 0) {
    if (target->size == 0) {
      target_local._4_4_ = 0;
    }
    else {
      iVar1 = *size;
      target_local._4_4_ = TPMT_SENSITIVE_Unmarshal(&target->sensitiveArea,buffer,size);
      if (target_local._4_4_ == 0) {
        if ((uint)target->size == iVar1 - *size) {
          target_local._4_4_ = 0;
        }
        else {
          target_local._4_4_ = 0x95;
        }
      }
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPM2B_SENSITIVE_Unmarshal(TPM2B_SENSITIVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    INT32    startSize;
    result = UINT16_Unmarshal((UINT16 *)&(target->size), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    // if size equal to 0, the rest of the structure is a zero buffer.  Stop processing
    if(target->size == 0)
        return TPM_RC_SUCCESS;
    startSize = *size;
    result = TPMT_SENSITIVE_Unmarshal((TPMT_SENSITIVE *)&(target->sensitiveArea), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(target->size != (startSize - *size)) return TPM_RC_SIZE;
    return TPM_RC_SUCCESS;
}